

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cases.cpp
# Opt level: O2

Clause * __thiscall
Inferences::Cases::performParamodulation(Cases *this,Clause *premise,Literal *lit,TermList t)

{
  TermList arg2;
  Self this_00;
  int iVar1;
  ulong uVar2;
  Literal *pLVar3;
  Literal **ppLVar4;
  TermList sort;
  Clause *pCVar5;
  uint uVar6;
  uint uVar7;
  RStack<Literal_*> resLits;
  GeneratingInference1 local_70;
  Inference local_60;
  
  uVar2 = (ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
  pCVar5 = (Clause *)0x0;
  if (((lit->super_Term)._args[uVar2]._content != t._content) &&
     ((lit->super_Term)._args[uVar2 - 1]._content != t._content)) {
    if (performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::troo == '\0') {
      iVar1 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                   ::troo);
      if (iVar1 != 0) {
        performParamodulation::troo._content = (uint64_t)Kernel::Term::foolTrue();
        __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                             ::troo);
      }
    }
    if (performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)::fols == '\0') {
      iVar1 = __cxa_guard_acquire(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                                   ::fols);
      if (iVar1 != 0) {
        performParamodulation::fols._content = (uint64_t)Kernel::Term::foolFalse();
        __cxa_guard_release(&performParamodulation(Kernel::Clause*,Kernel::Literal*,Kernel::TermList)
                             ::fols);
      }
    }
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled(&resLits);
    uVar6 = *(uint *)&premise->field_0x38 & 0xfffff;
    uVar7 = (uint)(uVar6 != 0);
    ppLVar4 = (Literal **)0x0;
    if (uVar6 != 0) {
      ppLVar4 = premise->_literals;
    }
    while (this_00._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                resLits._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
          arg2._content = performParamodulation::fols._content, ppLVar4 != (Literal **)0x0) {
      pLVar3 = *ppLVar4;
      if (pLVar3 == lit) {
        pLVar3 = Kernel::EqHelper::replace(pLVar3,t,performParamodulation::troo);
      }
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)
                 this_00._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,pLVar3)
      ;
      ppLVar4 = premise->_literals + (int)uVar7;
      if (uVar6 <= uVar7) {
        ppLVar4 = (Literal **)0x0;
      }
      uVar7 = uVar7 + (uVar7 < uVar6);
    }
    sort = Kernel::AtomicSort::boolSort();
    pLVar3 = Kernel::Literal::createEquality(true,t,arg2,sort);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               this_00._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,pLVar3);
    local_70.rule = FOOL_PARAMODULATION;
    local_70.premise = premise;
    Kernel::Inference::Inference(&local_60,&local_70);
    pCVar5 = Kernel::Clause::fromStack
                       ((Stack<Kernel::Literal_*> *)
                        resLits._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                        &local_60);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&resLits);
  }
  return pCVar5;
}

Assistant:

Clause* Cases::performParamodulation(Clause* premise, Literal* lit, TermList t) {
  ASS(t.isTerm());

  TermList lhs = *lit->nthArgument(0);
  TermList rhs = *lit->nthArgument(1);

  if((t == lhs) || (t == rhs)){
    return 0;
  }

  static TermList troo(Term::foolTrue());
  static TermList fols(Term::foolFalse());


  // Found a boolean term! Create the C[true] \/ s = false clause

  RStack<Literal*> resLits;

  // Copy the literals from the premise except for the one at `literalPosition`,
  // that has the occurrence of `booleanTerm` replaced with false
  for (Literal* curr : iterTraits(premise->iterLits())) {
    resLits->push( curr != lit 
        ? curr
        : EqHelper::replace(curr, t, troo));
  }

  // Add s = false to the clause
  resLits->push(Literal::createEquality(true, t, fols, AtomicSort::boolSort()));

  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::FOOL_PARAMODULATION, premise));
}